

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_shar.c
# Opt level: O1

ssize_t archive_write_shar_data_sed(archive_write *a,void *buff,size_t n)

{
  char cVar1;
  void *pvVar2;
  long lVar3;
  char *pcVar4;
  int iVar5;
  archive_string *paVar6;
  char *pcVar7;
  size_t written;
  size_t length;
  size_t sVar8;
  
  sVar8 = 0;
  if ((n != 0) && (pvVar2 = a->format_data, *(int *)((long)pvVar2 + 0x10) != 0)) {
    paVar6 = archive_string_ensure((archive_string *)((long)pvVar2 + 0x60),0x10000);
    if (paVar6 == (archive_string *)0x0) {
      archive_set_error(&a->archive,0xc,"Out of memory");
LAB_001a023c:
      sVar8 = 0xffffffffffffffe2;
    }
    else {
      if (0xfffd < *(ulong *)((long)pvVar2 + 0x68)) {
        iVar5 = __archive_write_output
                          (a,((archive_string *)((long)pvVar2 + 0x60))->s,
                           *(ulong *)((long)pvVar2 + 0x68));
        if (iVar5 != 0) {
          return -0x1e;
        }
        *(undefined8 *)((long)pvVar2 + 0x68) = 0;
      }
      lVar3 = *(long *)((long)pvVar2 + 0x60);
      pcVar7 = (char *)(*(long *)((long)pvVar2 + 0x68) + lVar3);
      if (*(int *)((long)pvVar2 + 4) != 0) {
        *pcVar7 = 'X';
        pcVar7 = pcVar7 + 1;
        *(undefined4 *)((long)pvVar2 + 4) = 0;
      }
      if (n != 0) {
        sVar8 = 0;
        do {
          cVar1 = *(char *)((long)buff + sVar8);
          *pcVar7 = cVar1;
          pcVar4 = pcVar7 + 1;
          if (cVar1 == '\n') {
            if (n - 1 == sVar8) {
              *(undefined4 *)((long)pvVar2 + 4) = 1;
            }
            else {
              pcVar7[1] = 'X';
              pcVar4 = pcVar7 + 2;
            }
          }
          pcVar7 = pcVar4;
          if ((char *)(lVar3 + 0xfffd) <= pcVar7) {
            length = (long)pcVar7 - (long)*(void **)((long)pvVar2 + 0x60);
            *(size_t *)((long)pvVar2 + 0x68) = length;
            iVar5 = __archive_write_output(a,*(void **)((long)pvVar2 + 0x60),length);
            if (iVar5 != 0) goto LAB_001a023c;
            *(undefined8 *)((long)pvVar2 + 0x68) = 0;
            pcVar7 = *(char **)((long)pvVar2 + 0x60);
          }
          sVar8 = sVar8 + 1;
        } while (n != sVar8);
      }
      *(long *)((long)pvVar2 + 0x68) = (long)pcVar7 - *(long *)((long)pvVar2 + 0x60);
      sVar8 = n;
    }
  }
  return sVar8;
}

Assistant:

static ssize_t
archive_write_shar_data_sed(struct archive_write *a, const void *buff, size_t n)
{
	static const size_t ensured = 65533;
	struct shar *shar;
	const char *src;
	char *buf, *buf_end;
	int ret;
	size_t written = n;

	shar = (struct shar *)a->format_data;
	if (!shar->has_data || n == 0)
		return (0);

	src = (const char *)buff;

	/*
	 * ensure is the number of bytes in buffer before expanding the
	 * current character.  Each operation writes the current character
	 * and optionally the start-of-new-line marker.  This can happen
	 * twice before entering the loop, so make sure three additional
	 * bytes can be written.
	 */
	if (archive_string_ensure(&shar->work, ensured + 3) == NULL) {
		archive_set_error(&a->archive, ENOMEM, "Out of memory");
		return (ARCHIVE_FATAL);
	}

	if (shar->work.length > ensured) {
		ret = __archive_write_output(a, shar->work.s,
		    shar->work.length);
		if (ret != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
		archive_string_empty(&shar->work);
	}
	buf = shar->work.s + shar->work.length;
	buf_end = shar->work.s + ensured;

	if (shar->end_of_line) {
		*buf++ = 'X';
		shar->end_of_line = 0;
	}

	while (n-- != 0) {
		if ((*buf++ = *src++) == '\n') {
			if (n == 0)
				shar->end_of_line = 1;
			else
				*buf++ = 'X';
		}

		if (buf >= buf_end) {
			shar->work.length = buf - shar->work.s;
			ret = __archive_write_output(a, shar->work.s,
			    shar->work.length);
			if (ret != ARCHIVE_OK)
				return (ARCHIVE_FATAL);
			archive_string_empty(&shar->work);
			buf = shar->work.s;
		}
	}

	shar->work.length = buf - shar->work.s;

	return (written);
}